

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx,void *context)

{
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_RESULT IVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  IOTHUB_CLIENT_RESULT IVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  LOG_CATEGORY LVar6;
  char *pcVar7;
  uint32_t blockNumber;
  IOTHUB_CLIENT_FILE_UPLOAD_RESULT IVar8;
  size_t sVar9;
  size_t blockDataSize;
  uchar *blockDataPtr;
  
  if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0 ||
      getDataCallbackEx == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",0x464,1,
                "invalid argument detected azureStorageClientHandle=%p getDataCallbackEx=%p",
                azureStorageClientHandle,getDataCallbackEx);
    }
  }
  else {
    blockNumber = 0;
    blockDataPtr = (uchar *)0x0;
    blockDataSize = 0;
    IVar1 = (*getDataCallbackEx)(FILE_UPLOAD_OK,&blockDataPtr,&blockDataSize,context);
    if (IVar1 != IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_ABORT) {
      do {
        if ((blockDataPtr == (uchar *)0x0) || (blockDataSize == 0)) {
          IVar8 = FILE_UPLOAD_OK;
          if (blockNumber == 0) {
            IVar2 = IOTHUB_CLIENT_OK;
            goto LAB_0012697e;
          }
          IVar3 = IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle);
          IVar2 = IOTHUB_CLIENT_OK;
          IVar8 = FILE_UPLOAD_OK;
          if (IVar3 == IOTHUB_CLIENT_OK) goto LAB_0012697e;
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00126978;
          pcVar7 = "Failed to perform Azure Blob Put Block List operation";
          LVar6 = AZ_LOG_ERROR;
          iVar5 = 0x4a5;
          goto LAB_001267c9;
        }
        if (0x6400000 < blockDataSize) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00126978;
          pcVar7 = "tried to upload block of size %lu, max allowed size is %d";
          iVar5 = 0x484;
          sVar9 = blockDataSize;
LAB_00126936:
          IVar2 = IOTHUB_CLIENT_ERROR;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",iVar5,1,pcVar7,sVar9);
          IVar8 = FILE_UPLOAD_ERROR;
          goto LAB_0012697e;
        }
        if (blockNumber == 50000) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar7 = "unable to upload more than %lu blocks in one blob";
            iVar5 = 0x48a;
            sVar9 = 50000;
            goto LAB_00126936;
          }
          goto LAB_00126978;
        }
        IVar2 = IoTHubClient_LL_UploadToBlob_PutBlock
                          (azureStorageClientHandle,blockNumber,blockDataPtr,blockDataSize);
        if (IVar2 != IOTHUB_CLIENT_OK) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00126978;
          pcVar7 = "failed uploading block to blob";
          LVar6 = AZ_LOG_ERROR;
          iVar5 = 0x490;
          goto LAB_001267c9;
        }
        blockNumber = blockNumber + 1;
        IVar1 = (*getDataCallbackEx)(FILE_UPLOAD_OK,&blockDataPtr,&blockDataSize,context);
      } while (IVar1 != IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_ABORT);
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00126978:
      IVar2 = IOTHUB_CLIENT_ERROR;
      IVar8 = FILE_UPLOAD_ERROR;
    }
    else {
      pcVar7 = "Upload to blob has been aborted by the user";
      LVar6 = AZ_LOG_INFO;
      iVar5 = 0x475;
LAB_001267c9:
      IVar2 = IOTHUB_CLIENT_ERROR;
      (*p_Var4)(LVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks",iVar5,1,pcVar7);
      IVar8 = FILE_UPLOAD_ERROR;
    }
LAB_0012697e:
    (*getDataCallbackEx)(IVar8,(uchar **)0x0,(size_t *)0x0,context);
  }
  return IVar2;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx, void* context)
{
    IOTHUB_CLIENT_RESULT result;

    if (azureStorageClientHandle == NULL || getDataCallbackEx == NULL)
    {
        LogError("invalid argument detected azureStorageClientHandle=%p getDataCallbackEx=%p", azureStorageClientHandle, getDataCallbackEx);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        unsigned int blockID = 0;
        bool isError;
        unsigned char const * blockDataPtr = NULL;
        size_t blockDataSize = 0;
        IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_RESULT getDataReturnValue;

        do
        {
            getDataReturnValue = getDataCallbackEx(FILE_UPLOAD_OK, &blockDataPtr, &blockDataSize, context);

            if (getDataReturnValue == IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_ABORT)
            {
                LogInfo("Upload to blob has been aborted by the user");
                isError = true;
                break;
            }
            else if (blockDataPtr == NULL || blockDataSize == 0)
            {
                // This is how the user indicates that there is no more data to be uploaded,
                // and the function can end with success result.
                isError = false;
                break;
            }
            else
            {
                if (blockDataSize > BLOCK_SIZE)
                {
                    LogError("tried to upload block of size %lu, max allowed size is %d", (unsigned long)blockDataSize, BLOCK_SIZE);
                    isError = true;
                    break;
                }
                else if (blockID >= MAX_BLOCK_COUNT)
                {
                    LogError("unable to upload more than %lu blocks in one blob", (unsigned long)MAX_BLOCK_COUNT);
                    isError = true;
                    break;
                }
                else if (IoTHubClient_LL_UploadToBlob_PutBlock(azureStorageClientHandle, blockID, blockDataPtr, blockDataSize) != IOTHUB_CLIENT_OK)
                {
                    LogError("failed uploading block to blob");
                    isError = true;
                    break;
                }

                blockID++;
            }
        }
        while(true);

        if (isError)
        {
            (void)getDataCallbackEx(FILE_UPLOAD_ERROR, NULL, NULL, context);
            result = IOTHUB_CLIENT_ERROR;
        }
        // Checking if blockID is greater than 0 guarantees that PUT BLOCK LIST will only
        // be attempted if at least one block has indeed been uploaded to Azure Storage.
        // This behavior follows the behavior of the original implementation of
        // Upload-to-Blob in azure-iot-sdk-c.
        else if (blockID > 0 && IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed to perform Azure Blob Put Block List operation");
            (void)getDataCallbackEx(FILE_UPLOAD_ERROR, NULL, NULL, context);
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            (void)getDataCallbackEx(FILE_UPLOAD_OK, NULL, NULL, context);
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}